

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O1

HaF64 __thiscall
dgVertexCollapseVertexMetric::Evalue(dgVertexCollapseVertexMetric *this,dgVector *p)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 in_XMM0_Qa;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 in_XMM2_Qa;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 in_XMM4_Qa;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  auVar5._0_8_ = (double)(p->super_dgTemplateVector<float>).m_x;
  auVar5._8_8_ = in_XMM0_Qa;
  auVar9._0_8_ = (double)(p->super_dgTemplateVector<float>).m_y;
  auVar9._8_8_ = in_XMM2_Qa;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = auVar5._0_8_ * (double)this->elem[0];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = auVar9._0_8_ * (double)this->elem[1] * auVar9._0_8_;
  auVar4 = vfmadd231sd_fma(auVar10,auVar5,auVar7);
  auVar8._0_8_ = (double)(p->super_dgTemplateVector<float>).m_z;
  auVar8._8_8_ = in_XMM4_Qa;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = auVar8._0_8_ * (double)this->elem[2];
  auVar4 = vfmadd213sd_fma(auVar13,auVar8,auVar4);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = auVar5._0_8_ * (double)this->elem[4];
  auVar4 = vfmadd213sd_fma(auVar11,auVar9,auVar4);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = auVar5._0_8_ * (double)this->elem[5];
  auVar4 = vfmadd213sd_fma(auVar14,auVar8,auVar4);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = auVar9._0_8_ * (double)this->elem[7];
  auVar2 = vfmadd213sd_fma(auVar12,auVar8,auVar4);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = this->elem[6];
  auVar4 = vfmadd231sd_fma(auVar2,auVar5,auVar4);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this->elem[8];
  auVar4 = vfmadd231sd_fma(auVar4,auVar9,auVar2);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = this->elem[9];
  auVar4 = vfmadd231sd_fma(auVar4,auVar8,auVar1);
  auVar3._8_8_ = 0x7fffffffffffffff;
  auVar3._0_8_ = 0x7fffffffffffffff;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = auVar4._0_8_ + (double)this->elem[3];
  auVar4 = vandpd_avx512vl(auVar6,auVar3);
  return auVar4._0_8_;
}

Assistant:

hacd::HaF64 Evalue (const dgVector &p) const 
	{
		hacd::HaF64 acc = elem[0] * p.m_x * p.m_x + elem[1] * p.m_y * p.m_y + elem[2] * p.m_z * p.m_z + 
						elem[4] * p.m_x * p.m_y + elem[5] * p.m_x * p.m_z + elem[7] * p.m_y * p.m_z + 
						elem[6] * p.m_x + elem[8] * p.m_y + elem[9] * p.m_z + elem[3];  
		return fabs (acc);
	}